

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

void __thiscall
baryonyx::itm::quadratic_cost_type<long_double>::
make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
          (quadratic_cost_type<long_double> *this,int n,
          linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *rng)

{
  longdouble *plVar1;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  undefined8 extraout_RAX;
  pointer in_RCX;
  pointer ppVar5;
  long lVar6;
  pointer ppVar7;
  baryonyx *this_00;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__urng;
  int iVar8;
  long in_R8;
  pointer ppVar9;
  pointer ppVar10;
  pointer ppVar11;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_long_double>
  __aurng;
  longdouble in_ST0;
  longdouble lVar12;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar13;
  vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_> r;
  vector<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>_>_>
  q;
  allocator_type local_89;
  longdouble local_88;
  int local_7c;
  vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_> local_78;
  longdouble local_5c;
  quadratic_cost_type<long_double> *local_50;
  vector<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>_>_>
  local_48;
  
  std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>::vector
            (&local_78,(long)n,(allocator_type *)&local_48);
  local_50 = this;
  std::
  vector<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>_>_>
  ::vector(&local_48,
           (long)(this->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl[n],&local_89);
  ppVar7 = local_78.
           super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (n != 0) {
    lVar6 = 0;
    iVar8 = 0;
    plVar1 = (local_50->linear_elements)._M_t.
             super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
             super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
             super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
    do {
      *(unkbyte10 *)
       ((long)&(local_78.
                super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->first + lVar6 * 2) =
           *(unkbyte10 *)((long)plVar1 + lVar6);
      *(int *)((long)&(local_78.
                       super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->second + lVar6 * 2) = iVar8;
      iVar8 = iVar8 + 1;
      lVar6 = lVar6 + 0x10;
      in_RCX = local_78.
               super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while ((ulong)(uint)n << 4 != lVar6);
  }
  ppVar5 = local_78.
           super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar9 = local_78.
           super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_7c = n;
  if (local_78.
      super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_78.
      super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::quadratic_cost_type<long_double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              (local_78.
               super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_78.
               super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (int)LZCOUNT((long)local_78.
                                  super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_78.
                                  super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::quadratic_cost_type<long_double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              ();
    ppVar5 = local_78.
             super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ppVar9 = local_78.
             super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (ppVar10 = local_78.
                   super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppVar10 != ppVar5;
        ppVar10 = ppVar10 + 1) {
      lVar12 = ppVar10->first;
      local_88 = ppVar9->first;
      in_ST5 = in_ST4;
      if (((lVar12 != local_88) || (ppVar11 = ppVar9, NAN(lVar12) || NAN(local_88))) &&
         (in_RCX = (pointer)CONCAT71((int7)((ulong)in_RCX >> 8),ppVar10 == ppVar9),
         ppVar11 = ppVar10, 0x20 < (long)ppVar10 - (long)ppVar9)) {
        local_5c = lVar12 - local_88;
        lVar12 = in_ST0;
        lVar13 = in_ST1;
        lVar2 = in_ST2;
        lVar3 = in_ST3;
        lVar4 = in_ST4;
        do {
          in_ST4 = in_ST5;
          in_ST3 = lVar4;
          in_ST2 = lVar3;
          in_ST1 = lVar2;
          in_ST0 = lVar13;
          in_ST5 = in_ST4;
          std::
          generate_canonical<long_double,64ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                    ((longdouble *)rng,
                     (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)ppVar7
                    );
          ppVar9->first = local_88 + local_5c * lVar12;
          ppVar9 = ppVar9 + 1;
          lVar12 = in_ST0;
          lVar13 = in_ST1;
          lVar2 = in_ST2;
          lVar3 = in_ST3;
          lVar4 = in_ST4;
        } while (ppVar9 != ppVar10);
      }
      ppVar9 = ppVar11;
    }
  }
  if (0x20 < (long)ppVar5 - (long)ppVar9) {
    if ((long)ppVar9 -
        (long)local_78.
              super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0) {
      local_88 = ppVar9->first;
      lVar12 = (longdouble)1 + local_88;
      if ((local_88 == lVar12) && (!NAN(local_88) && !NAN(lVar12))) goto LAB_001b4dce;
      if (ppVar9 != ppVar5) {
        local_5c = lVar12 - local_88;
        __urng = (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)0x0;
        lVar12 = in_ST4;
        do {
          lVar13 = lVar12;
          std::
          generate_canonical<long_double,64ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                    ((longdouble *)rng,__urng);
          ppVar9->first = local_88 + local_5c * in_ST0;
          ppVar9 = ppVar9 + 1;
          in_ST0 = in_ST1;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = in_ST4;
          in_ST4 = lVar12;
          lVar12 = lVar13;
        } while (ppVar9 != ppVar5);
      }
    }
    else {
      this_00 = (baryonyx *)
                ((long)ppVar9 -
                 (long)local_78.
                       super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
      linearize<long,long_double>
                ((longdouble *)0x0,this_00,
                 (long)local_78.
                       super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_78.
                       super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5,
                 (local_78.
                  super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->first,(long)in_RCX,ppVar9->first,in_R8
                );
      local_88 = ppVar9->first;
      if ((local_88 == in_ST0) && (!NAN(local_88) && !NAN(in_ST0))) {
        make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>();
LAB_001b4dce:
        make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>();
        if (local_78.
            super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_78.
                          super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_78.
                                super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_78.
                                super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        _Unwind_Resume(extraout_RAX);
      }
      if (ppVar9 != ppVar5) {
        local_5c = in_ST0 - local_88;
        lVar12 = in_ST5;
        do {
          lVar13 = lVar12;
          std::
          generate_canonical<long_double,64ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                    ((longdouble *)rng,
                     (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                     this_00);
          ppVar9->first = local_88 + local_5c * in_ST1;
          ppVar9 = ppVar9 + 1;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = in_ST4;
          in_ST4 = in_ST5;
          in_ST5 = lVar12;
          lVar12 = lVar13;
        } while (ppVar9 != ppVar5);
      }
    }
  }
  ppVar7 = local_78.
           super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_78.
      super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_78.
      super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::quadratic_cost_type<long_double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_2_>>
              (local_78.
               super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_78.
               super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (int)LZCOUNT((long)local_78.
                                  super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_78.
                                  super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::quadratic_cost_type<long_double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_2_>>
              (ppVar7,local_78.
                      super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_7c != 0) {
    lVar6 = 0;
    plVar1 = (local_50->linear_elements)._M_t.
             super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
             super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
             super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
    do {
      *(unkbyte10 *)((long)plVar1 + lVar6) =
           *(unkbyte10 *)
            ((long)&(local_78.
                     super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->first + lVar6 * 2);
      lVar6 = lVar6 + 0x10;
    } while ((ulong)(uint)n << 4 != lVar6);
  }
  make_loo_norm(local_50,local_7c);
  if (local_48.
      super__Vector_base<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.
      super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void make_random_norm(int n, Random& rng)
    {
        std::vector<std::pair<Float, int>> r(n);
        std::vector<std::pair<quad, int>> q(indices[n]);

        for (int i = 0; i != n; ++i)
            r[i] = { linear_elements[i], i };

        std::sort(r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
            return lhs.first < rhs.first;
        });

        {
            auto begin = r.begin();
            auto end = r.end();
            auto next = r.begin()++;
            for (; next != end; ++next) {
                if (next->first != begin->first) {
                    if (std::distance(begin, next) > 1)
                        random_epsilon_unique(
                          begin, next, rng, begin->first, next->first);

                    begin = next;
                }
            }

            if (std::distance(begin, end) > 1) {
                if (begin == r.begin()) {
                    random_epsilon_unique(
                      begin, end, rng, begin->first, begin->first + 1);
                } else {
                    auto value = linearize(std::ptrdiff_t(0),
                                           r.front().first,
                                           std::distance(r.begin(), begin),
                                           begin->first,
                                           std::distance(r.begin(), r.end()));

                    random_epsilon_unique(
                      begin, end, rng, begin->first, value);
                }
            }

            // Reorder the vector according to the variable index, so,
            // it restores the initial order.

            std::sort(
              r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
                  return lhs.second < rhs.second;
              });
        }

        {
            // auto begin = q.begin();
            // auto end = q.end();
            // auto next = q.begin()++;
            // for (; next != end; ++next) {
            //     if (next->first != begin->first) {
            //         if (std::distance(begin, next) > 1)
            //             random_epsilon_unique(
            //               begin, next, rng, begin->first,
            //               next->first);

            //         begin = next;
            //     }
            // }

            // if (std::distance(begin, end) > 1) {
            //     if (begin == q.begin()) {
            //         random_epsilon_unique(
            //           begin, end, rng, begin->first, begin->first +
            //           1);
            //     } else {
            //         auto value = linearize(std::ptrdiff_t(0),
            //                                q.front().first,
            //                                std::distance(q.begin(),
            //                                begin), begin->first,
            //                                std::distance(q.begin(),
            //                                q.end()));

            //         random_epsilon_unique(
            //           begin, end, rng, begin->first, value);
            //     }
            // }

            // Reorder the vector according to the variable index, so,
            // it restores the initial order.

            // std::sort(
            //   q.begin(), q.end(), [](const auto& lhs, const auto&
            //   rhs) {
            //       return lhs.second < rhs.second;
            //   });
        }

        for (int i = 0; i != n; ++i)
            linear_elements[i] = r[i].first;
        // for (int i = 0; i != n; ++i) {
        //     quadratic_elements[i].factor = r[i].first.factor;

        // Finally we compute the l+oo norm.
        make_loo_norm(n);
    }